

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int lws_h2_parser(lws *wsi,uchar *in,lws_filepos_t inlen,lws_filepos_t *inused)

{
  int32_t *piVar1;
  undefined1 *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  undefined4 uVar7;
  lws_h2_netconn *plVar8;
  lws_h2_netconn *plVar9;
  lws_context *plVar10;
  lws *plVar11;
  uint uVar12;
  int iVar13;
  lws_h2_protocol_send *plVar14;
  lws *plVar15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  char *pcVar19;
  uint uVar20;
  uint32_t uVar21;
  byte *pbVar22;
  ulong uVar23;
  byte *buf;
  bool bVar24;
  
  plVar8 = (wsi->h2).h2n;
  pbVar22 = in;
  if (plVar8 == (lws_h2_netconn *)0x0) {
    iVar13 = 1;
  }
  else if (inlen == 0) {
    iVar13 = 0;
  }
  else {
    buf = in;
    do {
      uVar23 = inlen - 1;
      pbVar22 = buf + 1;
      bVar3 = *buf;
      uVar6 = (ushort)wsi->wsistate;
      uVar18 = (uint)bVar3;
      if (0x20b < uVar6) {
        if (uVar6 == 0x30d) goto LAB_0012ce63;
        if (uVar6 != 0x20c) goto LAB_0012e0d4;
        uVar17 = plVar8->count;
        uVar12 = uVar17 + 1;
        plVar8->count = uVar12;
        iVar13 = 1;
        if ((int)"PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n"[uVar17] == uVar18) {
          if ("PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n"[uVar12] != '\0') goto LAB_0012e0d4;
          _lws_log(8,"http2: %p: established\n",wsi);
          lwsi_set_state(wsi,0x30d);
          lws_validity_confirmed(wsi);
          plVar8->count = 0;
          (wsi->txc).tx_cr = 0xffff;
          plVar14 = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
          if (plVar14 != (lws_h2_protocol_send *)0x0) {
            plVar14->type = LWS_H2_PPS_MY_SETTINGS;
            lws_pps_schedule(wsi,plVar14);
            goto LAB_0012e0d4;
          }
LAB_0012e1a8:
          iVar13 = 1;
        }
        goto LAB_0012e100;
      }
      if ((uVar6 != 0x10f) && (uVar6 != 0x119)) goto LAB_0012e0d4;
LAB_0012ce63:
      bVar4 = plVar8->frame_state;
      if (bVar4 == 9) {
        uVar17 = plVar8->count;
        uVar20 = uVar17 + 1;
        plVar8->count = uVar20;
        bVar4 = plVar8->flags;
        uVar12 = (uint)bVar3;
        if (((bVar4 & 8) != 0) && ((*(ushort *)&plVar8->field_0xa8 & 0x40) == 0)) {
          plVar8->padding = bVar3;
          *(ushort *)&plVar8->field_0xa8 = *(ushort *)&plVar8->field_0xa8 | 0x40;
          plVar8->preamble = plVar8->preamble + 1;
          if (plVar8->length - 1 < uVar12) {
            pcVar19 = "execssive padding";
LAB_0012cf9a:
            lws_h2_goaway(wsi,1,pcVar19);
          }
          goto LAB_0012e0d4;
        }
        if (((bVar4 & 0x20) != 0) && ((plVar8->field_0xa8 & 0x80) == 0)) {
          _lws_log(0x10,"PRIORITY FLAG:  0x%x\n",(ulong)uVar12);
          uVar21 = plVar8->preamble;
          plVar8->preamble = uVar21 + 1;
          if (uVar21 - ((*(ushort *)&plVar8->field_0xa8 >> 6 & 1) != 0) < 4) {
            plVar8->dep = plVar8->dep << 8 | uVar12;
          }
          else {
            plVar8->weight_temp = bVar3;
            *(ushort *)&plVar8->field_0xa8 = *(ushort *)&plVar8->field_0xa8 | 0x80;
            _lws_log(0x10,"PRI FL: dep 0x%x, weight 0x%02X\n",(ulong)plVar8->dep,(ulong)uVar12);
          }
          goto LAB_0012e0d4;
        }
        if ((plVar8->padding != 0) && (plVar8->length - (uint)plVar8->padding < uVar20)) {
          if (bVar3 != 0) {
            pcVar19 = "nonzero padding";
            goto LAB_0012cf9a;
          }
          goto switchD_0012cfc6_caseD_5;
        }
        switch(plVar8->type) {
        case '\0':
          _lws_log(8,"%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n","lws_h2_parser");
          if (wsi->immortal_substream_count == '\0') {
            iVar13 = wsi->vhost->keepalive_timeout;
            if (iVar13 == 0) {
              iVar13 = 0x1f;
            }
            lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,iVar13);
          }
          if (plVar8->swsi != (lws *)0x0) {
            sVar16 = lws_buflist_next_segment_len(&plVar8->swsi->buflist,(uint8_t **)0x0);
            if (sVar16 != 0) {
              _lws_log(8,"%s: substream has pending\n","lws_h2_parser");
            }
            plVar15 = plVar8->swsi;
            if ((plVar15->role_ops == &role_ops_h1 || plVar15->role_ops == &role_ops_h2) &&
               ((short)plVar15->wsistate == 0x119)) {
              lwsi_set_state(plVar15,0x17);
              _lws_log(8,"%s: swsi %p to LRS_BODY\n","lws_h2_parser",plVar8->swsi);
            }
            iVar13 = lws_hdr_total_length(plVar8->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
            if ((((iVar13 == 0) || ((plVar8->swsi->http).rx_content_length == 0)) ||
                (inlen <= (plVar8->swsi->http).rx_content_remain)) ||
               (plVar8->length <= plVar8->inside)) {
              uVar18 = (plVar8->length - plVar8->count) + 1;
              if ((int)uVar23 < (int)uVar18) {
                uVar18 = (int)uVar23 + 1;
              }
              else {
                _lws_log(0x10,"---- restricting len to %d vs %ld\n",(ulong)uVar18,inlen);
              }
              plVar15 = plVar8->swsi;
              if ((*(ulong *)&plVar15->field_0x2dc >> 0x37 & 1) == 0) {
                if ((short)plVar15->wsistate == 0x110) {
                  iVar13 = lws_buflist_append_segment(&plVar15->buflist,buf,(long)(int)uVar18);
                  if (iVar13 < 0) {
                    return -1;
                  }
                  if (iVar13 != 0) {
                    plVar10 = wsi->context;
                    cVar5 = wsi->tsi;
                    _lws_log(0x10,"%s: added %p to rxflow list\n","lws_h2_parser");
                    lws_dll2_add_head(&plVar8->swsi->dll_buflist,
                                      &plVar10->pt[cVar5].dll_buflist_owner);
                  }
                  plVar8->inside = plVar8->inside + uVar18;
                  iVar13 = uVar18 - 1;
                  plVar8->count = plVar8->count + iVar13;
                  _lws_log(0x10,"%s: deferred %d\n","lws_h2_parser",(ulong)uVar18);
                }
                else {
                  *(ulong *)&plVar15->field_0x2dc = *(ulong *)&plVar15->field_0x2dc | 0x80000000000;
                  uVar18 = lws_read_h1(plVar8->swsi,buf,(long)(int)uVar18);
                  puVar2 = &plVar8->swsi->field_0x2dc;
                  *(ulong *)puVar2 = *(ulong *)puVar2 & 0xfffff7ffffffffff;
                  if (((int)uVar18 < 0) ||
                     ((uVar18 == 0 &&
                      (sVar16 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)0x0),
                      sVar16 == 0)))) {
                    _lws_log(8,"%s: lws_read_h1 told %d %u / %u\n","lws_h2_parser",(ulong)uVar18,
                             (ulong)plVar8->count,(ulong)plVar8->length);
                    uVar21 = plVar8->length;
                    pbVar22 = pbVar22 + (uVar21 - plVar8->count);
                    plVar8->inside = uVar21;
                    plVar8->count = uVar21 - 1;
                    goto LAB_0012e24a;
                  }
                  plVar8->inside = plVar8->inside + uVar18;
                  iVar13 = uVar18 - 1;
                  plVar8->count = plVar8->count + iVar13;
                  piVar1 = &(plVar8->swsi->txc).peer_tx_cr_est;
                  *piVar1 = *piVar1 - uVar18;
                  piVar1 = &(wsi->txc).peer_tx_cr_est;
                  *piVar1 = *piVar1 - uVar18;
                }
                pbVar22 = pbVar22 + iVar13;
                uVar23 = uVar23 - (long)iVar13;
                plVar15 = plVar8->swsi;
                if ((plVar15->flags & 0x200) == 0) {
                  if ((plVar15->txc).peer_tx_cr_est <= (int)uVar18) {
                    lws_h2_update_peer_txcredit(plVar15,plVar8->sid,uVar18);
                  }
                }
                else {
                  lws_h2_update_peer_txcredit(wsi,0,uVar18);
                  (plVar8->swsi->txc).manual = '\x01';
                }
              }
              else {
                sVar16 = (size_t)(int)uVar18;
                if (plVar15->protocol == (lws_protocols *)0x0) {
                  bVar24 = false;
                  _lws_log(1,"%s: swsi %p doesn\'t have protocol\n","lws_h2_parser");
                }
                else {
                  piVar1 = &(plVar15->txc).peer_tx_cr_est;
                  *piVar1 = *piVar1 - uVar18;
                  piVar1 = &(wsi->txc).peer_tx_cr_est;
                  *piVar1 = *piVar1 - uVar18;
                  lws_wsi_txc_describe(&plVar15->txc,"lws_h2_parser",(plVar15->mux).my_sid);
                  plVar15 = plVar8->swsi;
                  iVar13 = user_callback_handle_rxflow
                                     (plVar15->protocol->callback,plVar15,
                                      LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,plVar15->user_space,buf,
                                      sVar16);
                  bVar24 = iVar13 == 0;
                }
                pbVar22 = pbVar22 + (sVar16 - 1);
                plVar8->inside = plVar8->inside + uVar18;
                plVar8->count = (plVar8->count + uVar18) - 1;
                if (!bVar24) {
                  _lws_log(8,"RECEIVE_CLIENT_HTTP closed it\n");
LAB_0012e24a:
                  lws_close_free_wsi(plVar8->swsi,LWS_CLOSE_STATUS_NOSTATUS,"close_swsi_and_return")
                  ;
                  plVar8->swsi = (lws *)0x0;
                  plVar8->frame_state = '\0';
                  plVar8->count = 0;
                  iVar13 = 2;
                  goto LAB_0012e100;
                }
                uVar23 = uVar23 - (sVar16 - 1);
              }
            }
            else {
              lws_h2_goaway(wsi,1,"More rx than content_length told");
            }
          }
          break;
        case '\x01':
        case '\t':
          if ((plVar8->swsi != (lws *)0x0) &&
             (iVar13 = lws_hpack_interpret(plVar8->swsi,bVar3), iVar13 != 0)) {
            _lws_log(8,"%s: hpack failed\n","lws_h2_parser");
            goto LAB_0012e1a8;
          }
          break;
        case '\x02':
          if (uVar20 < 5) {
            plVar8->dep = plVar8->dep << 8 | uVar18;
          }
          else {
            plVar8->weight_temp = bVar3;
            _lws_log(8,"PRIORITY: dep 0x%x, weight 0x%02X\n",(ulong)plVar8->dep,(ulong)bVar3);
            if ((plVar8->dep & 0x7fffffff) == plVar8->sid) {
              lws_h2_goaway(wsi,1,"cant depend on own sid");
            }
          }
          break;
        case '\x03':
        case '\b':
          plVar8->hpack_e_dep = plVar8->hpack_e_dep << 8 | uVar18;
          break;
        case '\x04':
          uVar18 = (uVar17 - plVar8->preamble) % 6;
          plVar8->one_setting[uVar18] = bVar3;
          if (uVar18 == 5) {
            lws_h2_settings(wsi,&plVar8->peer_set,plVar8->one_setting,6);
          }
          break;
        case '\x05':
        case '\n':
          break;
        case '\x06':
          if ((bVar4 & 1) == 0) {
            if (8 < uVar20) {
              return 1;
            }
            plVar8->ping_payload[uVar17] = bVar3;
          }
          break;
        case '\a':
          uVar17 = plVar8->inside;
          plVar8->inside = uVar17 + 1;
          if (uVar17 - 4 < 4) {
            plVar8->goaway_err = plVar8->goaway_err << 8 | uVar18;
          }
          else if (uVar17 < 4) {
            plVar8->goaway_last_sid = plVar8->goaway_last_sid << 8 | uVar18;
            plVar8->goaway_str[0] = '\0';
          }
          else {
            if (uVar17 - 8 < 0x1f) {
              plVar8->goaway_str[uVar17 - 8] = bVar3;
            }
            plVar8->goaway_str[0x1f] = '\0';
          }
          break;
        default:
          _lws_log(4,"%s: unhandled frame type %d\n","lws_h2_parser",(ulong)plVar8->type);
          goto LAB_0012e135;
        }
switchD_0012cfc6_caseD_5:
        if (plVar8->count <= plVar8->length) {
          if ((plVar8->count == plVar8->length) &&
             (iVar13 = lws_h2_parse_end_of_frame(wsi), iVar13 != 0)) goto LAB_0012e1a8;
          goto LAB_0012e0d4;
        }
        _lws_log(4,"%s: count > length %u %u\n","lws_h2_parser");
LAB_0012e135:
        iVar13 = 1;
        goto LAB_0012e100;
      }
      if (bVar4 < 9) {
        plVar8->frame_state = bVar4 + 1;
        switch(bVar4) {
        case 0:
          plVar8->field_0xa8 = plVar8->field_0xa8 & 0x3f;
          plVar8->padding = '\0';
          plVar8->preamble = 0;
          plVar8->length = uVar18;
          plVar8->inside = 0;
          break;
        case 1:
        case 2:
          plVar8->length = plVar8->length << 8 | uVar18;
          break;
        case 3:
          plVar8->type = bVar3;
          break;
        case 4:
          plVar8->flags = bVar3;
          break;
        default:
          plVar8->sid = plVar8->sid << 8 | uVar18;
        }
      }
      if (plVar8->frame_state != '\t') goto LAB_0012e0d4;
      plVar9 = (wsi->h2).h2n;
      plVar9->count = 0;
      plVar9->swsi = wsi;
      uVar18 = plVar9->sid;
      uVar17 = uVar18 & 0x7fffffff;
      plVar9->sid = uVar17;
      if ((uVar18 & 1) == 0 && uVar17 != 0) {
        uVar21 = 1;
        pcVar19 = "Even Stream ID";
LAB_0012d0de:
        lws_h2_goaway(wsi,uVar21,pcVar19);
        goto LAB_0012e0d4;
      }
      if (wsi->immortal_substream_count == '\0') {
        iVar13 = wsi->vhost->keepalive_timeout;
        if (iVar13 == 0) {
          iVar13 = 0x1f;
        }
        lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,iVar13);
      }
      if (plVar9->sid != 0) {
        plVar15 = lws_wsi_mux_from_id(wsi,plVar9->sid);
        plVar9->swsi = plVar15;
      }
      _lws_log(0x10,"%p (%p): fr hdr: typ 0x%x, fla 0x%x, sid 0x%x, len 0x%x\n",wsi,plVar9->swsi,
               (ulong)plVar9->type,(ulong)plVar9->flags,(ulong)plVar9->sid,(ulong)plVar9->length);
      if (((plVar9->field_0xa8 & 0x20) != 0) && (plVar9->highest_sid < plVar9->sid)) {
        plVar9->type = '\n';
      }
      if (plVar9->type == '\n') goto LAB_0012e0d4;
      if ((plVar9->our_set).s[5] < plVar9->length) {
        _lws_log(8,"%s: received oversize frame %d\n","lws_h2_parse_frame_header");
        lws_h2_goaway(wsi,6,"Peer ignored our frame size setting");
LAB_0012e170:
        iVar13 = 1;
        goto LAB_0012e100;
      }
      plVar15 = plVar9->swsi;
      if (plVar15 == (lws *)0x0) {
        if (plVar9->type == '\0') {
          if ((plVar9->highest_sid_opened < plVar9->sid) || ((wsi->field_0x2e2 & 0x40) == 0)) {
            uVar21 = 5;
            pcVar19 = "Data for nonexistent sid";
            goto LAB_0012d0de;
          }
          _lws_log(4,"ignoring straggling data fl 0x%x\n",(ulong)plVar9->flags);
          plVar9->type = '\n';
        }
        if ((plVar9->sid <= plVar9->highest_sid_opened) || ((byte)(plVar9->type - 1) < 2))
        goto LAB_0012d204;
        _lws_log(8,"%s: wsi %p, No child for sid %d, rxcmd %d\n","lws_h2_parse_frame_header",
                 plVar9->swsi);
        uVar21 = 5;
        pcVar19 = "Data for nonexistent sid";
LAB_0012d738:
        lws_h2_goaway(wsi,uVar21,pcVar19);
        goto LAB_0012e0d4;
      }
      _lws_log(8,"%s: wsi %p, State: %s, received cmd %d\n","lws_h2_parse_frame_header",plVar15,
               h2_state_names[(plVar15->h2).h2_state]);
LAB_0012d204:
      plVar15 = plVar9->swsi;
      if ((plVar15 != (lws *)0x0) && (plVar9->sid != 0)) {
        bVar3 = (plVar15->h2).h2_state;
        if ((http2_rx_validity[bVar3] >> (plVar9->type & 0x1f) & 1) == 0) {
          _lws_log(8,"%s: wsi %p, State: %s, ILLEGAL cmdrx %d (OK 0x%x)\n",
                   "lws_h2_parse_frame_header",plVar15,h2_state_names[bVar3],(ulong)plVar9->type,
                   (ulong)http2_rx_validity[bVar3]);
          uVar21 = (uint)(((plVar9->swsi->h2).h2_state & 0xfd) == 4) * 4 + 1;
          pcVar19 = "invalid rx for state";
          goto LAB_0012d738;
        }
      }
      if (((*(ushort *)&plVar9->field_0xa8 & 8) != 0) &&
         ((plVar9->cont_exp_sid != plVar9->sid || (plVar9->type != '\t')))) {
        _lws_log(8,"%s: expected cont on sid %u (got %d on sid %u)\n","lws_h2_parse_frame_header",
                 (ulong)plVar9->cont_exp_sid,(ulong)plVar9->type);
        uVar6 = *(ushort *)&plVar9->field_0xa8;
        *(ushort *)&plVar9->field_0xa8 = uVar6 & 0xfff7;
        uVar21 = ((uVar6 & 0x10) >> 1) + 1;
        pcVar19 = "Continuation hdrs State";
        goto LAB_0012d738;
      }
      switch((ulong)plVar9->type) {
      case 0:
        _lws_log(8,"seen incoming LWS_H2_FRAME_TYPE_DATA start\n");
        if (plVar9->sid == 0) {
          _lws_log(8,"DATA: 0 sid\n");
          uVar21 = 1;
          pcVar19 = "DATA 0 sid";
        }
        else {
          _lws_log(8,"Frame header DATA: sid %u, flags 0x%x, len %u\n",(ulong)plVar9->sid,
                   (ulong)plVar9->flags,(ulong)plVar9->length);
          if (plVar9->swsi == (lws *)0x0) {
            iVar13 = 4;
            pcVar19 = "DATA: NULL swsi\n";
            goto LAB_0012dc83;
          }
          _lws_log(8,"DATA rx on state %d\n",(ulong)(plVar9->swsi->h2).h2_state);
          if (((plVar9->swsi->h2).h2_state | 2) != 6) {
            if (plVar9->length == 0) {
              lws_h2_parse_end_of_frame(wsi);
            }
            goto switchD_0012d26f_caseD_a;
          }
          uVar21 = 5;
          pcVar19 = "conn closed";
        }
        break;
      case 1:
        _lws_log(8,"HEADERS: frame header: sid = %u\n",(ulong)plVar9->sid);
        uVar18 = plVar9->sid;
        if (uVar18 == 0) {
          pcVar19 = "sid 0";
        }
        else {
          plVar15 = plVar9->swsi;
          if (((plVar15 == (lws *)0x0) || (((plVar15->h2).field_0x11 & 3) != 2)) ||
             ((plVar9->flags & 1) != 0)) {
            if ((wsi->field_0x2e2 & 0x40) != 0) {
              plVar15 = lws_wsi_mux_from_id(wsi,uVar18);
              plVar9->swsi = plVar15;
              _lws_log(8,"HEADERS: nwsi %p: sid %u mapped to wsi %p\n",wsi,(ulong)plVar9->sid,
                       plVar15);
              if (plVar9->swsi != (lws *)0x0) goto LAB_0012dff7;
              goto switchD_0012d26f_caseD_a;
            }
            if (plVar15 != (lws *)0x0) {
LAB_0012dab5:
              if (((plVar9->swsi->http).ah != (allocated_headers *)0x0) ||
                 (iVar13 = lws_header_table_attach(plVar9->swsi,0), iVar13 == 0)) {
                plVar15 = (wsi->mux).child_list;
                while (plVar15 != (lws *)0x0) {
                  if (((plVar15->mux).my_sid < plVar9->sid) && ((plVar15->h2).h2_state == '\0')) {
                    lws_close_free_wsi(plVar15,LWS_CLOSE_STATUS_NOSTATUS,"h2 sid close");
                  }
                  plVar11 = (plVar15->mux).sibling_list;
                  bVar24 = plVar11 == plVar15;
                  plVar15 = plVar11;
                  if (bVar24) {
                    __assert_fail("w->mux.sibling_list != w",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/h2/http2.c"
                                  ,0x4e5,"int lws_h2_parse_frame_header(struct lws *)");
                  }
                }
                plVar15 = plVar9->swsi;
                if ((plVar15->vhost->options & 0x100000000) == 0) {
                  (plVar15->h2).field_0x11 = (plVar15->h2).field_0x11 & 0xfe | plVar9->flags & 1;
                  _lws_log(0x10,"%s: hdr END_STREAM = %d\n","lws_h2_parse_frame_header",
                           (ulong)((byte)(plVar9->swsi->h2).field_0x11 & 1));
                }
                else {
                  lws_mux_mark_immortal(plVar15);
                  _lws_log(8,"%s: %p: h2 stream entering long poll\n","lws_h2_parse_frame_header",
                           plVar9->swsi);
                }
                uVar7._0_1_ = plVar9->flags;
                uVar7._1_1_ = plVar9->padding;
                uVar7._2_1_ = plVar9->weight_temp;
                uVar7._3_1_ = plVar9->huff_pad;
                plVar9->cont_exp_sid = plVar9->sid;
                *(ushort *)&plVar9->field_0xa8 =
                     (*(ushort *)&plVar9->field_0xa8 & 0xffe7) + (~(ushort)uVar7 & 4) * 2 + 0x10;
                goto LAB_0012dff7;
              }
              iVar13 = 1;
              _lws_log(1,"%s: Failed to get ah\n","lws_h2_parse_frame_header");
              goto LAB_0012e100;
            }
            if ((((wsi->h2).h2n)->our_set).s[3] < (wsi->mux).child_count + 1) {
              pcVar19 = "Another stream not allowed";
            }
            else {
              plVar15 = lws_wsi_server_new(wsi->vhost,wsi,uVar18);
              plVar9->swsi = plVar15;
              if (plVar15 != (lws *)0x0) {
                puVar2 = &(plVar15->h2).field_0x11;
                *puVar2 = *puVar2 | 0x10;
                iVar13 = lws_h2_update_peer_txcredit
                                   (plVar9->swsi,(plVar9->swsi->mux).my_sid,0x40000);
                if (iVar13 != 0) goto LAB_0012e170;
                goto LAB_0012dab5;
              }
              pcVar19 = "OOM";
            }
          }
          else {
            pcVar19 = "extra HEADERS together";
          }
        }
LAB_0012e2d0:
        iVar13 = 1;
        lws_h2_goaway(wsi,1,pcVar19);
        goto LAB_0012e100;
      case 2:
        _lws_log(8,"LWS_H2_FRAME_TYPE_PRIORITY complete frame\n");
        if (plVar9->sid == 0) {
          uVar21 = 1;
          pcVar19 = "Priority has 0 sid";
        }
        else {
          if (plVar9->length == 5) goto switchD_0012d26f_caseD_a;
          uVar21 = 6;
          pcVar19 = "Priority has length other than 5";
        }
        break;
      case 3:
        if (plVar9->sid == 0) goto LAB_0012e170;
        if (plVar15 == (lws *)0x0) {
          if (plVar9->highest_sid_opened < plVar9->sid) {
            pcVar19 = "crazy sid on RST_STREAM";
            goto LAB_0012e2d0;
          }
        }
        else {
          if (plVar9->length != 4) {
            uVar21 = 6;
            pcVar19 = "RST_STREAM can only be length 4";
            break;
          }
          lws_h2_state(plVar15,LWS_H2_STATE_CLOSED);
        }
        goto switchD_0012d26f_caseD_a;
      case 4:
        _lws_log(8,"LWS_H2_FRAME_TYPE_SETTINGS complete frame\n");
        if (plVar9->sid != 0) {
          uVar21 = 1;
          pcVar19 = "Settings has nonzero sid";
          break;
        }
        uVar18 = plVar9->length;
        if ((plVar9->flags & 1) == 0) {
          if ((uVar18 == 0) || (uVar18 % 6 != 0)) {
            uVar21 = 6;
            pcVar19 = "Settings length error";
            break;
          }
          if (plVar9->type == '\n') goto LAB_0012e0d4;
          if (((*(ulong *)&wsi->field_0x2dc & 4) != 0) &&
             (((*(ulong *)&wsi->field_0x2dc & 0x40) == 0 || ((wsi->flags & 0x20U) == 0)))) {
            plVar14 = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
            if (plVar14 == (lws_h2_protocol_send *)0x0) goto LAB_0012e170;
            plVar14->type = LWS_H2_PPS_ACK_SETTINGS;
            lws_pps_schedule(wsi,plVar14);
            wsi->field_0x2dc = wsi->field_0x2dc | 0x40;
          }
        }
        else if (uVar18 != 0) {
          uVar21 = 6;
          pcVar19 = "Settings with ACK not allowed payload";
          break;
        }
        goto switchD_0012d26f_caseD_a;
      case 5:
        _lws_log(8,"LWS_H2_FRAME_TYPE_PUSH_PROMISE complete frame\n");
        uVar21 = 1;
        pcVar19 = "Server only";
        break;
      case 6:
        if (plVar9->sid == 0) {
          if (plVar9->length == 8) goto switchD_0012d26f_caseD_a;
          uVar21 = 6;
          pcVar19 = "Ping payload can only be 8";
        }
        else {
          uVar21 = 1;
          pcVar19 = "Ping has nonzero sid";
        }
        break;
      case 7:
        iVar13 = 0x10;
        pcVar19 = "LWS_H2_FRAME_TYPE_GOAWAY received\n";
LAB_0012dc83:
        _lws_log(iVar13,pcVar19);
        goto switchD_0012d26f_caseD_a;
      case 8:
        if (plVar9->length == 4) {
          iVar13 = 8;
          pcVar19 = "LWS_H2_FRAME_TYPE_WINDOW_UPDATE\n";
          goto LAB_0012dc83;
        }
        uVar21 = 6;
        pcVar19 = "window update frame not 4";
        break;
      case 9:
        _lws_log(8,"LWS_H2_FRAME_TYPE_CONTINUATION: sid = %u %d %d\n",(ulong)plVar9->sid,
                 (ulong)(*(ushort *)&plVar9->field_0xa8 >> 3 & 1),(ulong)plVar9->cont_exp_sid);
        if ((((plVar9->field_0xa8 & 8) == 0) ||
            (plVar9->sid == 0 || plVar9->cont_exp_sid != plVar9->sid)) ||
           (plVar9->swsi == (lws *)0x0)) {
          uVar21 = 1;
          pcVar19 = "unexpected CONTINUATION";
        }
        else {
          if (((plVar9->swsi->h2).field_0x11 & 2) == 0) {
LAB_0012dff7:
            (plVar9->swsi->h2).field_0x11 =
                 (plVar9->swsi->h2).field_0x11 & 0xfd | plVar9->flags >> 1 & 2;
            _lws_log(8,"%p: END_HEADERS %d\n",plVar9->swsi,
                     (ulong)((byte)(plVar9->swsi->h2).field_0x11 >> 1 & 1));
            if (((plVar9->swsi->h2).field_0x11 & 2) != 0) {
              plVar9->field_0xa8 = plVar9->field_0xa8 & 0xf7;
            }
            _lws_log(0x10,"END_HEADERS %d\n",(ulong)((byte)(plVar9->swsi->h2).field_0x11 >> 1 & 1));
            goto switchD_0012d26f_caseD_a;
          }
          uVar21 = 1;
          pcVar19 = "END_HEADERS already seen";
        }
        break;
      case 10:
        goto switchD_0012d26f_caseD_a;
      default:
        _lws_log(8,"%s: ILLEGAL FRAME TYPE %d\n","lws_h2_parse_frame_header",(ulong)plVar9->type);
        plVar9->type = '\n';
        goto switchD_0012d26f_caseD_a;
      }
      lws_h2_goaway(wsi,uVar21,pcVar19);
switchD_0012d26f_caseD_a:
      if (plVar9->length == 0) {
        plVar9->frame_state = '\0';
      }
LAB_0012e0d4:
      inlen = uVar23;
      buf = pbVar22;
    } while (uVar23 != 0);
    iVar13 = 0;
  }
LAB_0012e100:
  *inused = (long)pbVar22 - (long)in;
  return iVar13;
}

Assistant:

int
lws_h2_parser(struct lws *wsi, unsigned char *in, lws_filepos_t inlen,
	      lws_filepos_t *inused)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;
	unsigned char c, *oldin = in;
	int n, m;

	if (!h2n)
		goto fail;

	while (inlen--) {

		c = *in++;

		// lwsl_notice("%s: 0x%x\n", __func__, c);

		switch (lwsi_state(wsi)) {
		case LRS_H2_AWAIT_PREFACE:
			if (preface[h2n->count++] != c)
				goto fail;

			if (preface[h2n->count])
				break;

			lwsl_info("http2: %p: established\n", wsi);
			lwsi_set_state(wsi, LRS_H2_AWAIT_SETTINGS);
			lws_validity_confirmed(wsi);
			h2n->count = 0;
			wsi->txc.tx_cr = 65535;

			/*
			 * we must send a settings frame -- empty one is OK...
			 * that must be the first thing sent by server
			 * and the peer must send a SETTINGS with ACK flag...
			 */
			pps = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
			if (!pps)
				goto fail;
			lws_pps_schedule(wsi, pps);
			break;

		case LRS_H2_WAITING_TO_SEND_HEADERS:
		case LRS_ESTABLISHED:
		case LRS_H2_AWAIT_SETTINGS:
			if (h2n->frame_state != LWS_H2_FRAME_HEADER_LENGTH)
				goto try_frame_start;

			/*
			 * post-header, preamble / payload / padding part
			 */
			h2n->count++;

			if (h2n->flags & LWS_H2_FLAG_PADDED &&
			    !h2n->pad_length) {
				/*
				 * Get the padding count... actual padding is
				 * at the end of the frame.
				 */
				h2n->padding = c;
				h2n->pad_length = 1;
				h2n->preamble++;

				if (h2n->padding > h2n->length - 1)
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
						      "execssive padding");
				break; /* we consumed this */
			}

			if (h2n->flags & LWS_H2_FLAG_PRIORITY &&
			    !h2n->collected_priority) {
				/* going to be 5 preamble bytes */

				lwsl_debug("PRIORITY FLAG:  0x%x\n", c);

				if (h2n->preamble++ - h2n->pad_length < 4) {
					h2n->dep = ((h2n->dep) << 8) | c;
					break; /* we consumed this */
				}
				h2n->weight_temp = c;
				h2n->collected_priority = 1;
				lwsl_debug("PRI FL: dep 0x%x, weight 0x%02X\n",
					   (unsigned int)h2n->dep,
					   h2n->weight_temp);
				break; /* we consumed this */
			}
			if (h2n->padding && h2n->count >
			    (h2n->length - h2n->padding)) {
				if (c) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "nonzero padding");
					break;
				}
				goto frame_end;
			}

			/* applies to wsi->h2.swsi which may be wsi */
			switch(h2n->type) {

			case LWS_H2_FRAME_TYPE_SETTINGS:
				n = (h2n->count - 1 - h2n->preamble) %
				     LWS_H2_SETTINGS_LEN;
				h2n->one_setting[n] = c;
				if (n != LWS_H2_SETTINGS_LEN - 1)
					break;
				lws_h2_settings(wsi, &h2n->peer_set,
						h2n->one_setting,
						LWS_H2_SETTINGS_LEN);
				break;

			case LWS_H2_FRAME_TYPE_CONTINUATION:
			case LWS_H2_FRAME_TYPE_HEADERS:
				if (!h2n->swsi)
					break;
				if (lws_hpack_interpret(h2n->swsi, c)) {
					lwsl_info("%s: hpack failed\n",
						  __func__);
					goto fail;
				}
				break;

			case LWS_H2_FRAME_TYPE_GOAWAY:
				switch (h2n->inside++) {
				case 0:
				case 1:
				case 2:
				case 3:
					h2n->goaway_last_sid <<= 8;
					h2n->goaway_last_sid |= c;
					h2n->goaway_str[0] = '\0';
					break;

				case 4:
				case 5:
				case 6:
				case 7:
					h2n->goaway_err <<= 8;
					h2n->goaway_err |= c;
					break;

				default:
					if (h2n->inside - 9 <
					    sizeof(h2n->goaway_str) - 1)
						h2n->goaway_str[
						           h2n->inside - 9] = c;
					h2n->goaway_str[
					    sizeof(h2n->goaway_str) - 1] = '\0';
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_DATA:

				lwsl_info("%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n",
					  __func__, h2n->flags);

				/*
				 * let the network wsi live a bit longer if
				 * subs are active... our frame may take a long
				 * time to chew through
				 */
				if (!wsi->immortal_substream_count)
					lws_set_timeout(wsi,
					PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
						wsi->vhost->keepalive_timeout ?
					    wsi->vhost->keepalive_timeout : 31);

				if (!h2n->swsi)
					break;

				if (lws_buflist_next_segment_len(
						&h2n->swsi->buflist, NULL))
					lwsl_info("%s: substream has pending\n",
						  __func__);

				if (lwsi_role_http(h2n->swsi) &&
				    lwsi_state(h2n->swsi) == LRS_ESTABLISHED) {
					lwsi_set_state(h2n->swsi, LRS_BODY);
					lwsl_info("%s: swsi %p to LRS_BODY\n",
							__func__, h2n->swsi);
				}

				if (lws_hdr_total_length(h2n->swsi,
					     WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
				    h2n->swsi->http.rx_content_length &&
				    h2n->swsi->http.rx_content_remain <
						    inlen + 1 && /* last */
				    h2n->inside < h2n->length) {
					/* unread data in frame */
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
					    "More rx than content_length told");
					break;
				}

				/*
				 * We operate on a frame.  The RX we have at
				 * hand may exceed the current frame.
				 */

				n = (int)inlen + 1;
				if (n > (int)(h2n->length - h2n->count + 1)) {
					n = h2n->length - h2n->count + 1;
					lwsl_debug("---- restricting len to %d "
						   "vs %ld\n", n, (long)inlen + 1);
				}
#if defined(LWS_WITH_CLIENT)
				if (h2n->swsi->client_mux_substream) {
					if (!h2n->swsi->protocol) {
						lwsl_err("%s: swsi %p doesn't have protocol\n",
							 __func__, h2n->swsi);
						m = 1;
					} else {
						h2n->swsi->txc.peer_tx_cr_est -= n;
						wsi->txc.peer_tx_cr_est -= n;
						lws_wsi_txc_describe(&h2n->swsi->txc,
							__func__,
							h2n->swsi->mux.my_sid);
					m = user_callback_handle_rxflow(
						h2n->swsi->protocol->callback,
						h2n->swsi,
					  LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
						h2n->swsi->user_space,
						in - 1, n);
					}

					in += n - 1;
					h2n->inside += n;
					h2n->count += n - 1;
					inlen -= n - 1;

					if (m) {
						lwsl_info("RECEIVE_CLIENT_HTTP "
							  "closed it\n");
						goto close_swsi_and_return;
					}

					break;
				}
#endif

				if (lwsi_state(h2n->swsi) == LRS_DEFERRING_ACTION) {
					m = lws_buflist_append_segment(
						&h2n->swsi->buflist, in - 1, n);
					if (m < 0)
						return -1;
					if (m) {
						struct lws_context_per_thread *pt;

						pt = &wsi->context->pt[(int)wsi->tsi];
						lwsl_debug("%s: added %p to rxflow list\n",
							   __func__, wsi);
						lws_dll2_add_head(
							&h2n->swsi->dll_buflist,
							&pt->dll_buflist_owner);
					}
					in += n - 1;
					h2n->inside += n;
					h2n->count += n - 1;
					inlen -= n - 1;

					lwsl_debug("%s: deferred %d\n", __func__, n);
					goto do_windows;
				}

				h2n->swsi->outer_will_close = 1;
				/*
				 * choose the length for this go so that we end at
				 * the frame boundary, in the case there is already
				 * more waiting leave it for next time around
				 */

				n = lws_read_h1(h2n->swsi, in - 1, n);
				// lwsl_notice("%s: lws_read_h1 %d\n", __func__, n);
				h2n->swsi->outer_will_close = 0;
				/*
				 * can return 0 in POST body with
				 * content len exhausted somehow.
				 */
				if (n < 0 ||
				    (!n && !lws_buflist_next_segment_len(
						    &wsi->buflist, NULL))) {
					lwsl_info("%s: lws_read_h1 told %d %u / %u\n",
						__func__, n,
						(unsigned int)h2n->count,
						(unsigned int)h2n->length);
					in += h2n->length - h2n->count;
					h2n->inside = h2n->length;
					h2n->count = h2n->length - 1;

					//if (n < 0)
					//	goto already_closed_swsi;
					goto close_swsi_and_return;
				}

				inlen -= n - 1;
				in += n - 1;
				h2n->inside += n;
				h2n->count += n - 1;
				h2n->swsi->txc.peer_tx_cr_est -= n;
				wsi->txc.peer_tx_cr_est -= n;

do_windows:

#if defined(LWS_WITH_CLIENT)
				if (!(h2n->swsi->flags & LCCSCF_H2_MANUAL_RXFLOW))
#endif
				{
					/*
					 * The default behaviour is we just keep
					 * cranking the other side's tx credit
					 * back up, for simple bulk transfer as
					 * fast as we can take it
					 */

					m = n; //(2 * h2n->length) + 65536;

					/* update both the stream and nwsi */

					lws_h2_update_peer_txcredit_thresh(h2n->swsi,
								    h2n->sid, m, m);
				}
#if defined(LWS_WITH_CLIENT)
				else {
					/*
					 * If he's handling it himself, only
					 * repair the nwsi credit but allow the
					 * stream credit to run down until the
					 * user code deals with it
					 */
					lws_h2_update_peer_txcredit(wsi, 0, n);
					h2n->swsi->txc.manual = 1;
				}
#endif
				break;

			case LWS_H2_FRAME_TYPE_PRIORITY:
				if (h2n->count <= 4) {
					h2n->dep <<= 8;
					h2n->dep |= c;
					break;
				}
				h2n->weight_temp = c;
				lwsl_info("PRIORITY: dep 0x%x, weight 0x%02X\n",
					  (unsigned int)h2n->dep, h2n->weight_temp);

				if ((h2n->dep & ~(1u << 31)) == h2n->sid) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "cant depend on own sid");
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_RST_STREAM:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_PUSH_PROMISE:
				break;

			case LWS_H2_FRAME_TYPE_PING:
				if (h2n->flags & LWS_H2_FLAG_SETTINGS_ACK) { // ack
				} else { /* they're sending us a ping request */
					if (h2n->count > 8)
						return 1;
					h2n->ping_payload[h2n->count - 1] = c;
				}
				break;

			case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_COUNT: /* IGNORING FRAME */
				break;

			default:
				lwsl_notice("%s: unhandled frame type %d\n",
					    __func__, h2n->type);

				goto fail;
			}

frame_end:
			if (h2n->count > h2n->length) {
				lwsl_notice("%s: count > length %u %u\n",
					    __func__, (unsigned int)h2n->count,
					    (unsigned int)h2n->length);
				goto fail;
			}
			if (h2n->count != h2n->length)
				break;

			/*
			 * end of frame just happened
			 */
			if (lws_h2_parse_end_of_frame(wsi))
				goto fail;

			break;

try_frame_start:
			if (h2n->frame_state <= 8) {

				switch (h2n->frame_state++) {
				case 0:
					h2n->pad_length = 0;
					h2n->collected_priority = 0;
					h2n->padding = 0;
					h2n->preamble = 0;
					h2n->length = c;
					h2n->inside = 0;
					break;
				case 1:
				case 2:
					h2n->length <<= 8;
					h2n->length |= c;
					break;
				case 3:
					h2n->type = c;
					break;
				case 4:
					h2n->flags = c;
					break;

				case 5:
				case 6:
				case 7:
				case 8:
					h2n->sid <<= 8;
					h2n->sid |= c;
					break;
				}
			}

			if (h2n->frame_state == LWS_H2_FRAME_HEADER_LENGTH)
				if (lws_h2_parse_frame_header(wsi))
					goto fail;
			break;

		default:
			break;
		}
	}

	*inused = in - oldin;

	return 0;

close_swsi_and_return:

	lws_close_free_wsi(h2n->swsi, 0, "close_swsi_and_return");
	h2n->swsi = NULL;
	h2n->frame_state = 0;
	h2n->count = 0;

// already_closed_swsi:
	*inused = in - oldin;

	return 2;

fail:
	*inused = in - oldin;

	return 1;
}

#if defined(LWS_WITH_CLIENT)
int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI);
	struct lws *nwsi = lws_get_network_wsi(wsi);
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	nwsi->h2.h2n->highest_sid_opened = sid;
	wsi->mux.my_sid = sid;

	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)uri,
				lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_ORIGIN),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_HOST),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_USER_AGENT,
				(unsigned char *)"lwsss", 5,
				&p, end))
		goto fail_length;

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

	if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, (end - p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

#if defined(LWS_WITH_DETAILED_LATENCY)
	wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, p - start, m);

	if (n != (p - start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}
#endif

int
lws_h2_ws_handshake(struct lws *wsi)
{
	uint8_t buf[LWS_PRE + 2048], *p = buf + LWS_PRE, *start = p,
		*end = &buf[sizeof(buf) - 1];
	const struct lws_http_mount *hit;
	const char * uri_ptr;
	int n, m;

	if (lws_add_http_header_status(wsi, HTTP_STATUS_OK, &p, end))
		return -1;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) > 64)
		return -1;

	if (wsi->proxied_ws_parent && wsi->child_list) {
		if (lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL)) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(uint8_t *)lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL),
				(int)strlen(lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL)),
						 &p, end))
			return -1;
		}
	} else {

		/* we can only return the protocol header if:
		 *  - one came in, and ... */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
		    /*  - it is not an empty string */
		    wsi->protocol->name && wsi->protocol->name[0]) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->protocol->name,
				(int)strlen(wsi->protocol->name), &p, end))
			return -1;
		}
	}

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	m = lws_ptr_diff(p, start);
	// lwsl_hexdump_notice(start, m);
	n = lws_write(wsi, start, m, LWS_WRITE_HTTP_HEADERS);
	if (n != m) {
		lwsl_err("_write returned %d from %d\n", n, m);

		return -1;
	}

	/*
	 * alright clean up, set our state to generic ws established, the
	 * mode / state of the nwsi will get the h2 processing done.
	 */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = 0; // ==LWS_RXPS_NEW;

	uri_ptr = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	hit = lws_find_mount(wsi, uri_ptr, n);

	if (hit && hit->cgienv &&
	    wsi->protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO, wsi->user_space,
				    (void *)hit->cgienv, 0))
		return 1;

	lws_validity_confirmed(wsi);

	return 0;
}

int
lws_read_h2(struct lws *wsi, unsigned char *buf, lws_filepos_t len)
{
	unsigned char *oldbuf = buf;
	lws_filepos_t body_chunk_len;

	// lwsl_notice("%s: h2 path: wsistate 0x%x len %d\n", __func__,
	//		wsi->wsistate, (int)len);

	/*
	 * wsi here is always the network connection wsi, not a stream
	 * wsi.  Once we unpicked the framing we will find the right
	 * swsi and make it the target of the frame.
	 *
	 * If it's ws over h2, the nwsi will get us here to do the h2
	 * processing, and that will call us back with the swsi +
	 * ESTABLISHED state for the inner payload, handled in a later
	 * case.
	 */
	while (len) {
		int m;

		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (lws_is_flowcontrolled(wsi)) {
			lws_rxflow_cache(wsi, buf, 0, (int)len);
			buf += len;
			break;
		}

		/*
		 * lws_h2_parser() may send something; when it gets the
		 * whole frame, it will want to perform some action
		 * involving a reply.  But we may be in a partial send
		 * situation on the network wsi...
		 *
		 * Even though we may be in a partial send and unable to
		 * send anything new, we still have to parse the network
		 * wsi in order to gain tx credit to send, which is
		 * potentially necessary to clear the old partial send.
		 *
		 * ALL network wsi-specific frames are sent by PPS
		 * already, these are sent as a priority on the writable
		 * handler, and so respect partial sends.  The only
		 * problem is when a stream wsi wants to send an, eg,
		 * reply headers frame in response to the parsing
		 * we will do now... the *stream wsi* must stall in a
		 * different state until it is able to do so from a
		 * priority on the WRITABLE callback, same way that
		 * file transfers operate.
		 */

		m = lws_h2_parser(wsi, buf, len, &body_chunk_len);
		if (m && m != 2) {
			lwsl_debug("%s: http2_parser bail: %d\n", __func__, m);
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "lws_read_h2 bail");

			return -1;
		}
		if (m == 2) {
			/* swsi has been closed */
			buf += body_chunk_len;
			break;
		}

		buf += body_chunk_len;
		len -= body_chunk_len;
	}

	return lws_ptr_diff(buf, oldbuf);
}

int
lws_h2_client_stream_long_poll_rxonly(struct lws *wsi)
{

	if (!wsi->mux_substream)
		return 1;

	/*
	 * Elect to send an empty DATA with END_STREAM, to force the stream
	 * into HALF_CLOSED LOCAL
	 */
	wsi->h2.long_poll = 1;
	wsi->h2.send_END_STREAM = 1;

	// lws_header_table_detach(wsi, 0);

	lws_callback_on_writable(wsi);

	return 0;
}